

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O3

void __thiscall Imath_3_2::Euler<float>::extract(Euler<float> *this,Matrix44<float> *M)

{
  byte bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float local_e8 [4];
  float local_d8;
  ulong local_c8;
  float local_bc;
  float local_b8 [4];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float local_68;
  long local_50;
  float local_48;
  
  bVar1 = this->field_0xc;
  bVar10 = bVar1 >> 3;
  uVar17 = bVar10 & 3;
  if ((bVar1 & 4) == 0) {
    iVar11 = 2;
    if ((bVar10 & 3) != 0) {
      iVar11 = uVar17 - 1;
    }
    uVar12 = ((uint)((byte)uVar17 < 2) * 3 + uVar17) - 2;
  }
  else {
    iVar11 = (uint)((byte)uVar17 < 2) * 3 + uVar17 + -2;
    uVar12 = 2;
    if ((bVar10 & 3) != 0) {
      uVar12 = uVar17 - 1;
    }
  }
  lVar16 = (long)iVar11;
  local_50 = lVar16;
  if ((bVar1 & 2) == 0) {
    uVar13 = (ulong)uVar12;
    fVar18 = atan2f(M->x[lVar16][uVar13],*(float *)((long)M->x + uVar13 * 0x14));
    (this->super_Vec3<float>).x = fVar18;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_e8[2] = 0.0;
    if ((this->field_0xc & 4) != 0) {
      fVar18 = -fVar18;
    }
    uVar14 = (ulong)(uVar17 * 4);
    *(float *)((long)local_e8 + uVar14) = fVar18;
    local_88 = 0;
    uStack_80 = 0x3f80000000000000;
    local_68 = local_e8[2];
    fVar18 = cosf(local_e8[2]);
    local_c8 = CONCAT44(local_c8._4_4_,fVar18);
    local_d8 = local_e8[1];
    local_48 = cosf(local_e8[1]);
    local_78 = local_e8[0];
    local_e8[3] = cosf(local_e8[0]);
    local_68 = sinf(local_68);
    local_d8 = sinf(local_d8);
    fVar18 = sinf(local_78);
    lVar15 = local_50;
    fVar23 = (float)local_c8 * local_d8 * fVar18 - local_68 * local_e8[3];
    fVar29 = (float)local_c8 * local_e8[3] + local_68 * local_d8 * fVar18;
    fVar36 = local_68 * fVar18 + local_e8[3] * (float)local_c8 * local_d8;
    fVar24 = local_e8[3] * local_68 * local_d8 - (float)local_c8 * fVar18;
    fVar19 = local_48 * local_68 * 0.0;
    fVar27 = -local_d8 * 0.0;
    fVar33 = (float)local_c8 * local_48 + fVar19 + fVar27;
    fVar26 = (float)local_c8 * local_48 * 0.0;
    fVar31 = local_48 * local_68 + fVar26 + fVar27;
    fVar26 = fVar26 + fVar19;
    fVar27 = fVar27 + fVar26;
    fVar26 = fVar26 - local_d8;
    fVar19 = fVar29 * 0.0;
    fVar34 = local_48 * fVar18 * 0.0;
    fVar32 = fVar23 + fVar19 + fVar34;
    fVar23 = fVar23 * 0.0;
    fVar30 = fVar29 + fVar23 + fVar34;
    fVar23 = fVar23 + fVar19;
    fVar28 = local_48 * fVar18 + fVar23;
    fVar23 = fVar23 + fVar34;
    fVar18 = fVar24 * 0.0;
    fVar19 = local_48 * local_e8[3] * 0.0;
    fVar37 = fVar36 * 0.0;
    fVar20 = fVar36 + fVar18 + fVar19;
    fVar25 = fVar24 + fVar37 + fVar19;
    fVar37 = fVar37 + fVar18;
    fVar35 = local_48 * local_e8[3] + fVar37;
    fVar37 = fVar37 + fVar19;
    fVar18 = M->x[0][0];
    fVar19 = M->x[0][1];
    fVar24 = M->x[0][2];
    fVar29 = M->x[0][3];
    fVar34 = M->x[1][0];
    fVar36 = M->x[1][1];
    fVar21 = M->x[1][2];
    fVar22 = M->x[1][3];
    fVar2 = M->x[2][0];
    fVar3 = M->x[2][1];
    fVar4 = M->x[2][2];
    fVar5 = M->x[2][3];
    fVar6 = M->x[3][0];
    fVar7 = M->x[3][1];
    fVar8 = M->x[3][2];
    fVar9 = M->x[3][3];
    local_b8[0] = fVar27 * fVar6 + fVar26 * fVar2 + fVar33 * fVar18 + fVar31 * fVar34;
    local_b8[1] = fVar27 * fVar7 + fVar26 * fVar3 + fVar33 * fVar19 + fVar31 * fVar36;
    local_b8[2] = fVar27 * fVar8 + fVar26 * fVar4 + fVar33 * fVar24 + fVar31 * fVar21;
    local_b8[3] = fVar27 * fVar9 + fVar26 * fVar5 + fVar33 * fVar29 + fVar31 * fVar22;
    local_a8 = fVar23 * fVar6 + fVar28 * fVar2 + fVar32 * fVar18 + fVar30 * fVar34;
    fStack_a4 = fVar23 * fVar7 + fVar28 * fVar3 + fVar32 * fVar19 + fVar30 * fVar36;
    fStack_a0 = fVar23 * fVar8 + fVar28 * fVar4 + fVar32 * fVar24 + fVar30 * fVar21;
    fStack_9c = fVar23 * fVar9 + fVar28 * fVar5 + fVar32 * fVar29 + fVar30 * fVar22;
    local_98 = fVar37 * fVar6 + fVar35 * fVar2 + fVar20 * fVar18 + fVar25 * fVar34;
    fStack_94 = fVar37 * fVar7 + fVar35 * fVar3 + fVar20 * fVar19 + fVar25 * fVar36;
    fStack_90 = fVar37 * fVar8 + fVar35 * fVar4 + fVar20 * fVar24 + fVar25 * fVar21;
    fStack_8c = fVar37 * fVar9 + fVar35 * fVar5 + fVar20 * fVar29 + fVar25 * fVar22;
    fVar21 = local_88._4_4_ * fVar21;
    fVar22 = local_88._4_4_ * fVar22;
    fVar24 = (float)local_88 * fVar24;
    fVar29 = (float)local_88 * fVar29;
    local_88 = CONCAT44(uStack_80._4_4_ * fVar7 +
                        (float)uStack_80 * fVar3 +
                        (float)local_88 * fVar19 + local_88._4_4_ * fVar36,
                        uStack_80._4_4_ * fVar6 +
                        (float)uStack_80 * fVar2 +
                        (float)local_88 * fVar18 + local_88._4_4_ * fVar34);
    uStack_80 = CONCAT44(uStack_80._4_4_ * fVar9 + (float)uStack_80 * fVar5 + fVar29 + fVar22,
                         uStack_80._4_4_ * fVar8 + (float)uStack_80 * fVar4 + fVar24 + fVar21);
    uVar17 = uVar17 << 4;
    fVar18 = *(float *)((long)local_b8 + uVar14 + uVar17);
    fVar19 = *(float *)((long)local_b8 + local_50 * 4 + (ulong)uVar17);
    fVar18 = atan2f(-*(float *)((long)local_b8 + uVar13 * 4 + (ulong)uVar17),
                    SQRT(fVar18 * fVar18 + fVar19 * fVar19));
    (this->super_Vec3<float>).y = fVar18;
    fVar19 = -*(float *)((long)local_b8 + uVar14 + lVar16 * 0x10);
    fVar18 = local_b8[lVar16 * 4 + lVar15];
  }
  else {
    uVar13 = (ulong)(uVar17 * 4);
    local_c8 = (ulong)uVar12;
    lVar15 = local_c8 * 0x10;
    fVar18 = atan2f(*(float *)((long)M->x[lVar16] + uVar13),
                    *(float *)((long)M->x[local_c8] + uVar13));
    (this->super_Vec3<float>).x = fVar18;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_e8[2] = 0.0;
    if ((this->field_0xc & 4) != 0) {
      fVar18 = -fVar18;
    }
    *(float *)((long)local_e8 + uVar13) = fVar18;
    local_88 = 0;
    uStack_80 = 0x3f80000000000000;
    local_d8 = local_e8[2];
    local_e8[3] = cosf(local_e8[2]);
    local_78 = local_e8[1];
    local_68 = cosf(local_e8[1]);
    local_bc = local_e8[0];
    local_48 = cosf(local_e8[0]);
    local_d8 = sinf(local_d8);
    local_78 = sinf(local_78);
    fVar18 = sinf(local_bc);
    fVar23 = local_e8[3] * local_78 * fVar18 - local_d8 * local_48;
    fVar29 = local_e8[3] * local_48 + local_d8 * local_78 * fVar18;
    fVar36 = local_d8 * fVar18 + local_48 * local_e8[3] * local_78;
    fVar24 = local_48 * local_d8 * local_78 - local_e8[3] * fVar18;
    fVar19 = local_68 * local_d8 * 0.0;
    fVar37 = -local_78 * 0.0;
    fVar32 = local_e8[3] * local_68 + fVar19 + fVar37;
    fVar26 = local_e8[3] * local_68 * 0.0;
    fVar30 = local_68 * local_d8 + fVar26 + fVar37;
    fVar26 = fVar26 + fVar19;
    fVar37 = fVar37 + fVar26;
    fVar26 = fVar26 - local_78;
    fVar19 = fVar29 * 0.0;
    fVar34 = local_68 * fVar18 * 0.0;
    fVar31 = fVar23 + fVar19 + fVar34;
    fVar23 = fVar23 * 0.0;
    fVar28 = fVar29 + fVar23 + fVar34;
    fVar23 = fVar23 + fVar19;
    fVar27 = local_68 * fVar18 + fVar23;
    fVar23 = fVar23 + fVar34;
    fVar18 = fVar24 * 0.0;
    fVar19 = local_68 * local_48 * 0.0;
    fVar35 = fVar36 * 0.0;
    fVar20 = fVar36 + fVar18 + fVar19;
    fVar25 = fVar24 + fVar35 + fVar19;
    fVar35 = fVar35 + fVar18;
    fVar33 = local_68 * local_48 + fVar35;
    fVar35 = fVar35 + fVar19;
    fVar18 = M->x[0][0];
    fVar19 = M->x[0][1];
    fVar24 = M->x[0][2];
    fVar29 = M->x[0][3];
    fVar34 = M->x[1][0];
    fVar36 = M->x[1][1];
    fVar21 = M->x[1][2];
    fVar22 = M->x[1][3];
    fVar2 = M->x[2][0];
    fVar3 = M->x[2][1];
    fVar4 = M->x[2][2];
    fVar5 = M->x[2][3];
    fVar6 = M->x[3][0];
    fVar7 = M->x[3][1];
    fVar8 = M->x[3][2];
    fVar9 = M->x[3][3];
    local_b8[0] = fVar37 * fVar6 + fVar26 * fVar2 + fVar32 * fVar18 + fVar30 * fVar34;
    local_b8[1] = fVar37 * fVar7 + fVar26 * fVar3 + fVar32 * fVar19 + fVar30 * fVar36;
    local_b8[2] = fVar37 * fVar8 + fVar26 * fVar4 + fVar32 * fVar24 + fVar30 * fVar21;
    local_b8[3] = fVar37 * fVar9 + fVar26 * fVar5 + fVar32 * fVar29 + fVar30 * fVar22;
    local_a8 = fVar23 * fVar6 + fVar27 * fVar2 + fVar31 * fVar18 + fVar28 * fVar34;
    fStack_a4 = fVar23 * fVar7 + fVar27 * fVar3 + fVar31 * fVar19 + fVar28 * fVar36;
    fStack_a0 = fVar23 * fVar8 + fVar27 * fVar4 + fVar31 * fVar24 + fVar28 * fVar21;
    fStack_9c = fVar23 * fVar9 + fVar27 * fVar5 + fVar31 * fVar29 + fVar28 * fVar22;
    local_98 = fVar35 * fVar6 + fVar33 * fVar2 + fVar20 * fVar18 + fVar25 * fVar34;
    fStack_94 = fVar35 * fVar7 + fVar33 * fVar3 + fVar20 * fVar19 + fVar25 * fVar36;
    fStack_90 = fVar35 * fVar8 + fVar33 * fVar4 + fVar20 * fVar24 + fVar25 * fVar21;
    fStack_8c = fVar35 * fVar9 + fVar33 * fVar5 + fVar20 * fVar29 + fVar25 * fVar22;
    fVar21 = local_88._4_4_ * fVar21;
    fVar22 = local_88._4_4_ * fVar22;
    fVar24 = (float)local_88 * fVar24;
    fVar29 = (float)local_88 * fVar29;
    local_88 = CONCAT44(uStack_80._4_4_ * fVar7 +
                        (float)uStack_80 * fVar3 +
                        (float)local_88 * fVar19 + local_88._4_4_ * fVar36,
                        uStack_80._4_4_ * fVar6 +
                        (float)uStack_80 * fVar2 +
                        (float)local_88 * fVar18 + local_88._4_4_ * fVar34);
    uStack_80 = CONCAT44(uStack_80._4_4_ * fVar9 + (float)uStack_80 * fVar5 + fVar29 + fVar22,
                         uStack_80._4_4_ * fVar8 + (float)uStack_80 * fVar4 + fVar24 + fVar21);
    fVar18 = *(float *)((long)local_b8 + uVar13 + lVar16 * 0x10);
    fVar19 = *(float *)((long)local_b8 + uVar13 + lVar15);
    fVar18 = atan2f(SQRT(fVar18 * fVar18 + fVar19 * fVar19),
                    *(float *)((long)local_b8 + uVar13 + (uVar17 << 4)));
    (this->super_Vec3<float>).y = fVar18;
    fVar19 = local_b8[lVar16 * 4 + local_c8];
    fVar18 = local_b8[lVar16 * 4 + local_50];
  }
  fVar18 = atan2f(fVar19,fVar18);
  (this->super_Vec3<float>).z = fVar18;
  bVar1 = this->field_0xc;
  if ((bVar1 & 4) == 0) {
    uVar13._0_4_ = (this->super_Vec3<float>).x;
    uVar13._4_4_ = (this->super_Vec3<float>).y;
    (this->super_Vec3<float>).x = (float)(int)(uVar13 ^ 0x8000000080000000);
    (this->super_Vec3<float>).y = (float)(int)((uVar13 ^ 0x8000000080000000) >> 0x20);
    fVar18 = -fVar18;
    (this->super_Vec3<float>).z = fVar18;
  }
  if ((bVar1 & 1) == 0) {
    fVar19 = (this->super_Vec3<float>).x;
    (this->super_Vec3<float>).x = fVar18;
    (this->super_Vec3<float>).z = fVar19;
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE void
Euler<T>::extract (const Matrix44<T>& M) IMATH_NOEXCEPT
{
    int i, j, k;
    angleOrder (i, j, k);

    if (_initialRepeated)
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][i], M[k][i]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);
        N = N * M;

        //
        // Extract the other two angles, y and z, from N.
        //

        T sy = std::sqrt (N[j][i] * N[j][i] + N[k][i] * N[k][i]);
        y    = std::atan2 (sy, N[i][i]);
        z    = std::atan2 (N[j][k], N[j][j]);
    }
    else
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][k], M[k][k]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);
        N = N * M;

        //
        // Extract the other two angles, y and z, from N.
        //

        T cy = std::sqrt (N[i][i] * N[i][i] + N[i][j] * N[i][j]);
        y    = std::atan2 (-N[i][k], cy);
        z    = std::atan2 (-N[j][i], N[j][j]);
    }

    if (!_parityEven) *this *= -1;

    if (!_frameStatic)
    {
        T t = x;
        x   = z;
        z   = t;
    }
}